

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::String> * __thiscall asl::Array<asl::String>::reserve(Array<asl::String> *this,int m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  void *pvVar5;
  int *piVar6;
  undefined8 *puVar7;
  int iVar8;
  int __fd;
  size_t __size;
  String *__dest;
  String *__src;
  
  __src = this->_a;
  iVar1 = *(int *)((long)&__src[-1].field_2 + 4);
  if (iVar1 < m) {
    iVar8 = iVar1 * 2;
    if (iVar1 * 2 <= m) {
      iVar8 = m;
    }
    iVar2 = *(int *)&__src[-1].field_2;
    if ((ulong)((long)iVar1 * 0x18) < 0x800) {
      pvVar5 = malloc((long)iVar8 * 0x18 + 0x10);
      if (pvVar5 == (void *)0x0) {
LAB_0011c46c:
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = dup2;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __dest = (String *)((long)pvVar5 + 0x10);
      if (iVar2 <= m) {
        m = iVar2;
      }
      memcpy(__dest,__src,(long)(m * 0x18));
      __fd = (int)__src;
    }
    else {
      dup(this,m);
      iVar3 = *(int *)((long)&this->_a[-1].field_2 + 8);
      __size = (long)iVar8 * 0x18 + 0x10;
      piVar6 = (int *)realloc(&this->_a[-1].field_2,__size);
      __fd = (int)__size;
      if (piVar6 == (int *)0x0) goto LAB_0011c46c;
      __dest = (String *)(piVar6 + 4);
      this->_a = __dest;
      piVar6[2] = iVar3;
      piVar6[1] = iVar8;
      *piVar6 = iVar2;
      iVar8 = iVar1;
    }
    if (iVar8 != iVar1) {
      dup(this,__fd);
      uVar4 = *(undefined4 *)((long)&this->_a[-1].field_2 + 8);
      ::free(&this->_a[-1].field_2);
      this->_a = __dest;
      *(undefined4 *)((long)&__dest[-1].field_2 + 8) = uVar4;
      *(int *)((long)&__dest[-1].field_2 + 4) = iVar8;
      *(int *)&__dest[-1].field_2 = iVar2;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}